

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O0

int tcu::measurePixelDiffAccuracy
              (TestLog *log,char *imageSetName,char *imageSetDesc,Surface *reference,Surface *result
              ,int bestScoreDiff,int worstScoreDiff,CompareLogMode logMode)

{
  int iVar1;
  ConstPixelBufferAccess local_88;
  ConstPixelBufferAccess local_60;
  int local_34;
  Surface *pSStack_30;
  int bestScoreDiff_local;
  Surface *result_local;
  Surface *reference_local;
  char *imageSetDesc_local;
  char *imageSetName_local;
  TestLog *log_local;
  
  local_34 = bestScoreDiff;
  pSStack_30 = result;
  result_local = reference;
  reference_local = (Surface *)imageSetDesc;
  imageSetDesc_local = imageSetName;
  imageSetName_local = (char *)log;
  Surface::getAccess(&local_60,reference);
  Surface::getAccess(&local_88,pSStack_30);
  iVar1 = measurePixelDiffAccuracy
                    (log,imageSetName,imageSetDesc,&local_60,&local_88,local_34,worstScoreDiff,
                     logMode);
  return iVar1;
}

Assistant:

int measurePixelDiffAccuracy (TestLog& log, const char* imageSetName, const char* imageSetDesc, const Surface& reference, const Surface& result, int bestScoreDiff, int worstScoreDiff, CompareLogMode logMode)
{
	return measurePixelDiffAccuracy(log, imageSetName, imageSetDesc, reference.getAccess(), result.getAccess(), bestScoreDiff, worstScoreDiff, logMode);
}